

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_half(secp256k1_fe *r)

{
  secp256k1_fe *psVar1;
  undefined8 a;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_fe *psVar12;
  secp256k1_fe *a_00;
  uint64_t *puVar13;
  uint64_t *puVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  secp256k1_fe *psVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  secp256k1_fe *psStack_188;
  ulong uStack_178;
  uint64_t uStack_170;
  ulong uStack_168;
  ulong uStack_160;
  uint64_t uStack_150;
  ulong uStack_148;
  uint64_t uStack_140;
  undefined1 auStack_130 [48];
  ulong uStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  secp256k1_fe *psStack_e8;
  secp256k1_fe sStack_e0;
  secp256k1_modinv64_trans2x2 sStack_b0;
  secp256k1_fe sStack_90;
  secp256k1_modinv64_signed62 sStack_60;
  secp256k1_fe *psStack_38;
  
  secp256k1_fe_verify(r);
  a_00 = r;
  secp256k1_fe_verify_magnitude(r,0x1f);
  modinfo = (secp256k1_modinv64_modinfo *)r->n[0];
  uVar3 = -(ulong)((uint)modinfo & 1);
  uVar6 = uVar3 >> 0xc;
  uVar19 = (long)(modinfo->modulus).v + (uVar6 & 0xffffefffffc2f);
  if ((uVar19 & 1) == 0) {
    uVar4 = (uVar3 >> 0x10) + r->n[4];
    uVar7 = uVar6 + r->n[3];
    uVar18 = (uint)(uVar3 >> 0x2c);
    auVar24._0_8_ = CONCAT44(uVar18,(int)uVar6);
    auVar24._8_4_ = (int)uVar6;
    auVar24._12_4_ = uVar18;
    uVar3 = auVar24._0_8_ + r->n[1];
    uVar6 = auVar24._8_8_ + r->n[2];
    r->n[0] = ((ulong)((uint)uVar3 & 1) << 0x33) + (uVar19 >> 1);
    r->n[1] = ((uVar6 & 1) << 0x33) + (uVar3 >> 1);
    r->n[2] = ((uVar7 & 1) << 0x33) + (uVar6 >> 1);
    r->n[3] = ((ulong)((uint)uVar4 & 1) << 0x33) + (uVar7 >> 1);
    r->n[4] = uVar4 >> 1;
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_half_cold_1();
  uVar7 = 0;
  sStack_90.n[2] = 0;
  sStack_90.n[3] = 0;
  sStack_90.n[0] = 0;
  sStack_90.n[1] = 0;
  sStack_90.n[4] = 0;
  sStack_60.v[3] = 0;
  sStack_60.v[4] = 0;
  sStack_60.v[1] = 0;
  sStack_60.v[2] = 0;
  sStack_60.v[0] = 1;
  uStack_178 = (modinfo->modulus).v[4];
  uVar3 = (modinfo->modulus).v[0];
  uStack_148 = (modinfo->modulus).v[1];
  uStack_160 = (modinfo->modulus).v[2];
  uVar6 = (modinfo->modulus).v[3];
  sStack_e0.n[0] = a_00->n[0];
  uStack_140 = a_00->n[1];
  uStack_150 = a_00->n[2];
  uStack_168 = a_00->n[3];
  uStack_170 = a_00->n[4];
  uVar4 = 0xffffffffffffffff;
  uVar19 = sStack_e0.n[0];
  auStack_130._0_8_ = uVar3;
  auStack_130._8_8_ = uStack_148;
  auStack_130._16_8_ = uStack_160;
  auStack_130._24_8_ = uVar6;
  auStack_130._32_8_ = uStack_178;
  auStack_130._40_8_ = a_00;
  sStack_e0.n[1] = uStack_140;
  sStack_e0.n[2] = uStack_150;
  sStack_e0.n[3] = uStack_168;
  sStack_e0.n[4] = uStack_170;
  psStack_38 = r;
  do {
    uVar22 = 8;
    lVar8 = 3;
    uVar11 = 0;
    uVar21 = 0;
    psVar12 = (secp256k1_fe *)0x8;
    psStack_188 = (secp256k1_fe *)0x8;
    uVar5 = uVar19;
    uVar9 = uVar3;
    do {
      if ((uVar9 & 1) == 0) {
        secp256k1_modinv64_cold_29();
LAB_00145262:
        secp256k1_modinv64_cold_1();
LAB_00145267:
        secp256k1_modinv64_cold_2();
LAB_0014526c:
        secp256k1_modinv64_cold_28();
        goto LAB_00145271;
      }
      a_00 = (secp256k1_fe *)(uVar11 * uVar19 + uVar22 * uVar3);
      psVar12 = (secp256k1_fe *)(uVar9 << ((byte)lVar8 & 0x3f));
      if (a_00 != psVar12) goto LAB_00145262;
      a_00 = (secp256k1_fe *)((long)psStack_188 * uVar19 + uVar21 * uVar3);
      psVar12 = (secp256k1_fe *)(uVar5 << ((byte)lVar8 & 0x3f));
      if (a_00 != psVar12) goto LAB_00145267;
      psVar12 = (secp256k1_fe *)((long)uVar4 >> 0x3f);
      uStack_f0 = (ulong)((uint)uVar5 & 1);
      uVar17 = -uStack_f0;
      a_00 = (secp256k1_fe *)((ulong)psVar12 & uVar17);
      psStack_e8 = psVar12;
      if ((uVar4 ^ (ulong)a_00) - 0x251 < 0xfffffffffffffb61) goto LAB_0014526c;
      uVar4 = (uVar4 ^ (ulong)a_00) - 1;
      psStack_188 = (secp256k1_fe *)
                    ((long)psStack_188->n + (((ulong)psVar12 ^ uVar11) - (long)psVar12 & uVar17));
      uVar11 = (uVar11 + ((ulong)psStack_188 & (ulong)a_00)) * 2;
      uVar21 = uVar21 + (((ulong)psVar12 ^ uVar22) - (long)psVar12 & uVar17);
      uVar22 = (uVar22 + (uVar21 & (ulong)a_00)) * 2;
      uVar17 = (((ulong)psVar12 ^ uVar9) - (long)psVar12 & uVar17) + uVar5;
      uVar5 = uVar17 >> 1;
      uVar9 = uVar9 + (uVar17 & (ulong)a_00);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x3e);
    psVar12 = (secp256k1_fe *)(uVar11 * uVar21);
    a_00 = psStack_188;
    uStack_f8 = uVar7;
    sStack_b0.u = uVar22;
    sStack_b0.v = uVar11;
    sStack_b0.q = uVar21;
    sStack_b0.r = (int64_t)psStack_188;
    if ((SUB168(SEXT816((long)uVar22) * SEXT816((long)psStack_188),8) -
        SUB168(SEXT816((long)uVar11) * SEXT816((long)uVar21),8)) -
        (ulong)((secp256k1_fe *)(uVar22 * (long)psStack_188) < psVar12) != 2 ||
        (long)(uVar22 * (long)psStack_188) - (long)psVar12 != 0) goto LAB_001452e9;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)&sStack_90,&sStack_60,&sStack_b0,modinfo);
    psVar20 = (secp256k1_fe *)auStack_130;
    psVar12 = (secp256k1_fe *)0x5;
    a_00 = psVar20;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar20,5,&modinfo->modulus,-1);
    if (iVar2 < 1) {
LAB_00145271:
      psVar20 = a_00;
      secp256k1_modinv64_cold_27();
LAB_00145276:
      secp256k1_modinv64_cold_26();
LAB_0014527b:
      a_00 = psVar20;
      secp256k1_modinv64_cold_25();
LAB_00145280:
      secp256k1_modinv64_cold_24();
LAB_00145285:
      secp256k1_modinv64_cold_4();
LAB_0014528a:
      secp256k1_modinv64_cold_5();
LAB_0014528f:
      secp256k1_modinv64_cold_21();
LAB_00145294:
      secp256k1_modinv64_cold_20();
LAB_00145299:
      secp256k1_modinv64_cold_19();
LAB_0014529e:
      secp256k1_modinv64_cold_18();
LAB_001452a3:
      secp256k1_modinv64_cold_17();
LAB_001452a8:
      secp256k1_modinv64_cold_16();
LAB_001452ad:
      secp256k1_modinv64_cold_15();
LAB_001452b2:
      secp256k1_modinv64_cold_14();
LAB_001452b7:
      secp256k1_modinv64_cold_13();
LAB_001452bc:
      secp256k1_modinv64_cold_12();
LAB_001452c1:
      psVar20 = a_00;
      secp256k1_modinv64_cold_11();
LAB_001452c6:
      secp256k1_modinv64_cold_10();
LAB_001452cb:
      a_00 = psVar20;
      secp256k1_modinv64_cold_9();
LAB_001452d0:
      secp256k1_modinv64_cold_8();
LAB_001452d5:
      secp256k1_modinv64_cold_23();
LAB_001452da:
      secp256k1_modinv64_cold_22();
      goto LAB_001452df;
    }
    psVar12 = (secp256k1_fe *)0x5;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar20,5,&modinfo->modulus,1);
    if (0 < iVar2) goto LAB_00145276;
    a_00 = &sStack_e0;
    psVar12 = (secp256k1_fe *)0x5;
    psVar20 = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,-1);
    if (iVar2 < 1) goto LAB_0014527b;
    psVar12 = (secp256k1_fe *)0x5;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,1)
    ;
    if (-1 < iVar2) goto LAB_00145280;
    psVar12 = (secp256k1_fe *)(uVar22 * uVar3);
    lVar8 = SUB168(SEXT816((long)uVar22) * SEXT816((long)uVar3),8);
    uVar7 = uVar11 * uVar19;
    a_00 = SUB168(SEXT816((long)uVar11) * SEXT816((long)uVar19),8);
    if ((-1 < (long)a_00) &&
       (uVar5 = (ulong)((secp256k1_fe *)(-1 - uVar7) < psVar12),
       lVar10 = (0x7fffffffffffffff - (long)a_00) - lVar8,
       (SBORROW8(0x7fffffffffffffff - (long)a_00,lVar8) != SBORROW8(lVar10,uVar5)) !=
       (long)(lVar10 - uVar5) < 0)) goto LAB_001452d5;
    puVar13 = (uint64_t *)((long)psVar12->n + uVar7);
    a_00 = (secp256k1_fe *)((long)a_00->n + (ulong)CARRY8(uVar7,(ulong)psVar12) + lVar8);
    uVar7 = uVar21 * uVar3;
    lVar8 = SUB168(SEXT816((long)uVar21) * SEXT816((long)uVar3),8);
    psVar12 = (secp256k1_fe *)((long)psStack_188 * uVar19);
    lVar10 = SUB168(SEXT816((long)psStack_188) * SEXT816((long)uVar19),8);
    if ((-1 < lVar10) &&
       (uVar3 = (ulong)(-(long)psVar12 - 1U < uVar7), lVar16 = (0x7fffffffffffffff - lVar10) - lVar8
       , (SBORROW8(0x7fffffffffffffff - lVar10,lVar8) != SBORROW8(lVar16,uVar3)) !=
         (long)(lVar16 - uVar3) < 0)) goto LAB_001452da;
    bVar23 = CARRY8((ulong)psVar12,uVar7);
    psVar12 = (secp256k1_fe *)((long)psVar12->n + uVar7);
    lVar8 = lVar10 + lVar8 + (ulong)bVar23;
    if (((ulong)puVar13 & 0x3ffffffffffffffe) != 0) goto LAB_00145285;
    if (((ulong)psVar12 & 0x3fffffffffffffff) != 0) goto LAB_0014528a;
    uVar3 = (ulong)puVar13 >> 0x3e | (long)a_00 * 4;
    uVar19 = uStack_148 * uVar22 + uVar3;
    lVar10 = SUB168(SEXT816((long)uStack_148) * SEXT816((long)uVar22),8) + ((long)a_00 >> 0x3e) +
             (ulong)CARRY8(uStack_148 * uVar22,uVar3);
    uVar3 = uStack_140 * uVar11;
    a_00 = SUB168(SEXT816((long)uStack_140) * SEXT816((long)uVar11),8);
    if (-1 < (long)a_00) {
      uVar7 = (ulong)(-uVar3 - 1 < uVar19);
      lVar16 = (0x7fffffffffffffff - (long)a_00) - lVar10;
      if ((SBORROW8(0x7fffffffffffffff - (long)a_00,lVar10) != SBORROW8(lVar16,uVar7)) ==
          (long)(lVar16 - uVar7) < 0) goto LAB_00144c34;
      goto LAB_0014528f;
    }
    lVar15 = (-0x8000000000000000 - (long)a_00) - (ulong)(uVar3 != 0);
    lVar16 = lVar10 - lVar15;
    if ((SBORROW8(lVar10,lVar15) != SBORROW8(lVar16,(ulong)(uVar19 < -uVar3))) !=
        (long)(lVar16 - (ulong)(uVar19 < -uVar3)) < 0) goto LAB_0014528f;
LAB_00144c34:
    uVar7 = (ulong)psVar12 >> 0x3e | lVar8 * 4;
    a_00 = (secp256k1_fe *)((long)a_00->n + (ulong)CARRY8(uVar3,uVar19) + lVar10);
    uVar5 = uStack_148 * uVar21 + uVar7;
    lVar8 = SUB168(SEXT816((long)uStack_148) * SEXT816((long)uVar21),8) + (lVar8 >> 0x3e) +
            (ulong)CARRY8(uStack_148 * uVar21,uVar7);
    uVar7 = uStack_140 * (long)psStack_188;
    psVar12 = SUB168(SEXT816((long)uStack_140) * SEXT816((long)psStack_188),8);
    if (-1 < (long)psVar12) {
      uVar9 = (ulong)(-uVar7 - 1 < uVar5);
      lVar10 = (0x7fffffffffffffff - (long)psVar12) - lVar8;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar12,lVar8) != SBORROW8(lVar10,uVar9)) ==
          (long)(lVar10 - uVar9) < 0) goto LAB_00144cb4;
      goto LAB_00145294;
    }
    lVar16 = (-0x8000000000000000 - (long)psVar12) - (ulong)(uVar7 != 0);
    lVar10 = lVar8 - lVar16;
    if ((SBORROW8(lVar8,lVar16) != SBORROW8(lVar10,(ulong)(uVar5 < -uVar7))) !=
        (long)(lVar10 - (ulong)(uVar5 < -uVar7)) < 0) goto LAB_00145294;
LAB_00144cb4:
    psVar12 = (secp256k1_fe *)((long)psVar12->n + (ulong)CARRY8(uVar7,uVar5) + lVar8);
    uVar9 = (long)a_00 * 4 | uVar3 + uVar19 >> 0x3e;
    uVar3 = uVar3 + uVar19 & 0x3fffffffffffffff;
    uStack_100 = uVar7 + uVar5 & 0x3fffffffffffffff;
    psVar20 = (secp256k1_fe *)(uStack_160 * uVar22 + uVar9);
    lVar8 = SUB168(SEXT816((long)uStack_160) * SEXT816((long)uVar22),8) + ((long)a_00 >> 0x3e) +
            (ulong)CARRY8(uStack_160 * uVar22,uVar9);
    uVar19 = uStack_150 * uVar11;
    lVar10 = SUB168(SEXT816((long)uStack_150) * SEXT816((long)uVar11),8);
    auStack_130._0_8_ = uVar3;
    sStack_e0.n[0] = uStack_100;
    if (-1 < lVar10) {
      a_00 = (secp256k1_fe *)(-1 - uVar19);
      lVar16 = (0x7fffffffffffffff - lVar10) - lVar8;
      if ((SBORROW8(0x7fffffffffffffff - lVar10,lVar8) != SBORROW8(lVar16,(ulong)(a_00 < psVar20)))
          == (long)(lVar16 - (ulong)(a_00 < psVar20)) < 0) goto LAB_00144d6a;
      goto LAB_00145299;
    }
    lVar15 = (-0x8000000000000000 - lVar10) - (ulong)(uVar19 != 0);
    lVar16 = lVar8 - lVar15;
    a_00 = (secp256k1_fe *)(lVar16 - (ulong)(psVar20 < (secp256k1_fe *)-uVar19));
    if ((SBORROW8(lVar8,lVar15) != SBORROW8(lVar16,(ulong)(psVar20 < (secp256k1_fe *)-uVar19))) !=
        (long)a_00 < 0) goto LAB_00145299;
LAB_00144d6a:
    uVar7 = uVar7 + uVar5 >> 0x3e | (long)psVar12 * 4;
    puVar13 = (uint64_t *)((long)psVar20->n + uVar19);
    lVar8 = lVar8 + lVar10 + (ulong)CARRY8((ulong)psVar20,uVar19);
    psVar20 = (secp256k1_fe *)(uStack_160 * uVar21 + uVar7);
    a_00 = (secp256k1_fe *)
           (SUB168(SEXT816((long)uStack_160) * SEXT816((long)uVar21),8) + ((long)psVar12 >> 0x3e) +
           (ulong)CARRY8(uStack_160 * uVar21,uVar7));
    uVar19 = uStack_150 * (long)psStack_188;
    lVar10 = SUB168(SEXT816((long)uStack_150) * SEXT816((long)psStack_188),8);
    if (-1 < lVar10) {
      psVar12 = (secp256k1_fe *)(-1 - uVar19);
      lVar16 = (0x7fffffffffffffff - lVar10) - (long)a_00;
      if ((SBORROW8(0x7fffffffffffffff - lVar10,(long)a_00) !=
          SBORROW8(lVar16,(ulong)(psVar12 < psVar20))) ==
          (long)(lVar16 - (ulong)(psVar12 < psVar20)) < 0) goto LAB_00144dd9;
      goto LAB_0014529e;
    }
    lVar15 = (-0x8000000000000000 - lVar10) - (ulong)(uVar19 != 0);
    lVar16 = (long)a_00 - lVar15;
    psVar12 = (secp256k1_fe *)(lVar16 - (ulong)(psVar20 < (secp256k1_fe *)-uVar19));
    if ((SBORROW8((long)a_00,lVar15) != SBORROW8(lVar16,(ulong)(psVar20 < (secp256k1_fe *)-uVar19)))
        != (long)psVar12 < 0) goto LAB_0014529e;
LAB_00144dd9:
    puVar14 = (uint64_t *)((long)psVar20->n + uVar19);
    a_00 = (secp256k1_fe *)((long)a_00->n + (ulong)CARRY8((ulong)psVar20,uVar19) + lVar10);
    uVar19 = lVar8 * 4 | (ulong)puVar13 >> 0x3e;
    uStack_148 = (ulong)puVar13 & 0x3fffffffffffffff;
    uStack_140 = (ulong)puVar14 & 0x3fffffffffffffff;
    uVar7 = uVar6 * uVar22 + uVar19;
    psVar12 = (secp256k1_fe *)
              (SUB168(SEXT816((long)uVar6) * SEXT816((long)uVar22),8) + (lVar8 >> 0x3e) +
              (ulong)CARRY8(uVar6 * uVar22,uVar19));
    uVar19 = uStack_168 * uVar11;
    lVar8 = SUB168(SEXT816((long)uStack_168) * SEXT816((long)uVar11),8);
    auStack_130._8_8_ = uStack_148;
    sStack_e0.n[1] = uStack_140;
    if (-1 < lVar8) {
      uVar5 = (ulong)(-uVar19 - 1 < uVar7);
      lVar10 = (0x7fffffffffffffff - lVar8) - (long)psVar12;
      if ((SBORROW8(0x7fffffffffffffff - lVar8,(long)psVar12) != SBORROW8(lVar10,uVar5)) ==
          (long)(lVar10 - uVar5) < 0) goto LAB_00144e6b;
      goto LAB_001452a3;
    }
    lVar16 = (-0x8000000000000000 - lVar8) - (ulong)(uVar19 != 0);
    lVar10 = (long)psVar12 - lVar16;
    if ((SBORROW8((long)psVar12,lVar16) != SBORROW8(lVar10,(ulong)(uVar7 < -uVar19))) !=
        (long)(lVar10 - (ulong)(uVar7 < -uVar19)) < 0) goto LAB_001452a3;
LAB_00144e6b:
    uVar5 = (ulong)puVar14 >> 0x3e | (long)a_00 * 4;
    psVar12 = (secp256k1_fe *)((long)psVar12->n + (ulong)CARRY8(uVar7,uVar19) + lVar8);
    psVar20 = (secp256k1_fe *)(uVar6 * uVar21 + uVar5);
    lVar8 = SUB168(SEXT816((long)uVar6) * SEXT816((long)uVar21),8) + ((long)a_00 >> 0x3e) +
            (ulong)CARRY8(uVar6 * uVar21,uVar5);
    uVar6 = uStack_168 * (long)psStack_188;
    lVar10 = SUB168(SEXT816((long)uStack_168) * SEXT816((long)psStack_188),8);
    if (-1 < lVar10) {
      a_00 = (secp256k1_fe *)(-1 - uVar6);
      lVar16 = (0x7fffffffffffffff - lVar10) - lVar8;
      if ((SBORROW8(0x7fffffffffffffff - lVar10,lVar8) != SBORROW8(lVar16,(ulong)(a_00 < psVar20)))
          == (long)(lVar16 - (ulong)(a_00 < psVar20)) < 0) goto LAB_00144ee3;
      goto LAB_001452a8;
    }
    lVar15 = (-0x8000000000000000 - lVar10) - (ulong)(uVar6 != 0);
    lVar16 = lVar8 - lVar15;
    a_00 = (secp256k1_fe *)(lVar16 - (ulong)(psVar20 < (secp256k1_fe *)-uVar6));
    if ((SBORROW8(lVar8,lVar15) != SBORROW8(lVar16,(ulong)(psVar20 < (secp256k1_fe *)-uVar6))) !=
        (long)a_00 < 0) goto LAB_001452a8;
LAB_00144ee3:
    puVar13 = (uint64_t *)((long)psVar20->n + uVar6);
    lVar8 = lVar8 + lVar10 + (ulong)CARRY8((ulong)psVar20,uVar6);
    uVar6 = (long)psVar12 * 4 | uVar7 + uVar19 >> 0x3e;
    uStack_160 = uVar7 + uVar19 & 0x3fffffffffffffff;
    uStack_150 = (ulong)puVar13 & 0x3fffffffffffffff;
    psVar20 = (secp256k1_fe *)(uStack_178 * uVar22 + uVar6);
    a_00 = (secp256k1_fe *)
           (SUB168(SEXT816((long)uStack_178) * SEXT816((long)uVar22),8) + ((long)psVar12 >> 0x3e) +
           (ulong)CARRY8(uStack_178 * uVar22,uVar6));
    uVar6 = uStack_170 * uVar11;
    lVar10 = SUB168(SEXT816((long)uStack_170) * SEXT816((long)uVar11),8);
    if (lVar10 < 0) {
      lVar15 = (-0x8000000000000000 - lVar10) - (ulong)(uVar6 != 0);
      lVar16 = (long)a_00 - lVar15;
      bVar23 = SBORROW8((long)a_00,lVar15) !=
               SBORROW8(lVar16,(ulong)(psVar20 < (secp256k1_fe *)-uVar6));
      psVar12 = (secp256k1_fe *)(lVar16 - (ulong)(psVar20 < (secp256k1_fe *)-uVar6));
      psVar1 = psVar12;
    }
    else {
      psVar12 = (secp256k1_fe *)(-1 - uVar6);
      lVar16 = (0x7fffffffffffffff - lVar10) - (long)a_00;
      bVar23 = SBORROW8(0x7fffffffffffffff - lVar10,(long)a_00) !=
               SBORROW8(lVar16,(ulong)(psVar12 < psVar20));
      psVar1 = (secp256k1_fe *)(lVar16 - (ulong)(psVar12 < psVar20));
    }
    auStack_130._16_8_ = uStack_160;
    sStack_e0.n[2] = uStack_150;
    if (bVar23 != (long)psVar1 < 0) goto LAB_001452ad;
    uVar19 = (ulong)puVar13 >> 0x3e | lVar8 * 4;
    puVar13 = (uint64_t *)((long)psVar20->n + uVar6);
    a_00 = (secp256k1_fe *)((long)a_00->n + (ulong)CARRY8((ulong)psVar20,uVar6) + lVar10);
    uVar7 = uStack_178 * uVar21 + uVar19;
    psVar12 = (secp256k1_fe *)
              (SUB168(SEXT816((long)uStack_178) * SEXT816((long)uVar21),8) + (lVar8 >> 0x3e) +
              (ulong)CARRY8(uStack_178 * uVar21,uVar19));
    uVar19 = uStack_170 * (long)psStack_188;
    lVar8 = SUB168(SEXT816((long)uStack_170) * SEXT816((long)psStack_188),8);
    if (-1 < lVar8) {
      uVar6 = (ulong)(-uVar19 - 1 < uVar7);
      lVar10 = (0x7fffffffffffffff - lVar8) - (long)psVar12;
      if ((SBORROW8(0x7fffffffffffffff - lVar8,(long)psVar12) != SBORROW8(lVar10,uVar6)) ==
          (long)(lVar10 - uVar6) < 0) goto LAB_0014502b;
      goto LAB_001452b2;
    }
    lVar16 = (-0x8000000000000000 - lVar8) - (ulong)(uVar19 != 0);
    lVar10 = (long)psVar12 - lVar16;
    if ((SBORROW8((long)psVar12,lVar16) != SBORROW8(lVar10,(ulong)(uVar7 < -uVar19))) !=
        (long)(lVar10 - (ulong)(uVar7 < -uVar19)) < 0) goto LAB_001452b2;
LAB_0014502b:
    psVar20 = (secp256k1_fe *)auStack_130;
    psVar12 = (secp256k1_fe *)((long)psVar12->n + (ulong)CARRY8(uVar7,uVar19) + lVar8);
    uStack_178 = (long)a_00 * 4 | (ulong)puVar13 >> 0x3e;
    uVar6 = (ulong)puVar13 & 0x3fffffffffffffff;
    uStack_168 = uVar7 + uVar19 & 0x3fffffffffffffff;
    a_00 = (secp256k1_fe *)(((long)a_00 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uStack_178));
    auStack_130._24_8_ = uVar6;
    sStack_e0.n[3] = uStack_168;
    if (a_00 != (secp256k1_fe *)0xffffffffffffffff) goto LAB_001452b7;
    uStack_170 = uVar7 + uVar19 >> 0x3e | (long)psVar12 * 4;
    psVar12 = (secp256k1_fe *)
              (((long)psVar12 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uStack_170));
    auStack_130._32_8_ = uStack_178;
    if (psVar12 != (secp256k1_fe *)0xffffffffffffffff) goto LAB_001452bc;
    psVar12 = (secp256k1_fe *)0x5;
    a_00 = psVar20;
    sStack_e0.n[4] = uStack_170;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar20,5,&modinfo->modulus,-1);
    if (iVar2 < 1) goto LAB_001452c1;
    psVar12 = (secp256k1_fe *)0x5;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar20,5,&modinfo->modulus,1);
    if (0 < iVar2) goto LAB_001452c6;
    a_00 = &sStack_e0;
    psVar12 = (secp256k1_fe *)0x5;
    psVar20 = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,-1);
    if (iVar2 < 1) goto LAB_001452cb;
    psVar12 = (secp256k1_fe *)0x5;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,1)
    ;
    if (-1 < iVar2) goto LAB_001452d0;
    uVar18 = (int)uStack_f8 + 1;
    uVar7 = (ulong)uVar18;
    uVar19 = uStack_100;
  } while (uVar18 != 10);
  a_00 = &sStack_e0;
  psVar12 = (secp256k1_fe *)0x5;
  iVar2 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar2 == 0) {
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_130,5,&SECP256K1_SIGNED62_ONE,-1);
    a = auStack_130._40_8_;
    if ((iVar2 == 0) ||
       (iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_130,5,&SECP256K1_SIGNED62_ONE,1),
       iVar2 == 0)) {
LAB_0014521b:
      secp256k1_modinv64_normalize_62((secp256k1_modinv64_signed62 *)&sStack_90,uStack_178,modinfo);
      ((uint64_t *)a)[4] = sStack_90.n[4];
      ((uint64_t *)a)[2] = sStack_90.n[2];
      ((uint64_t *)a)[3] = sStack_90.n[3];
      *(uint64_t *)a = sStack_90.n[0];
      ((uint64_t *)a)[1] = sStack_90.n[1];
      return;
    }
    psVar12 = (secp256k1_fe *)0x5;
    a_00 = (secp256k1_fe *)a;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar2 == 0) {
      a_00 = &sStack_90;
      psVar12 = (secp256k1_fe *)0x5;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar2 == 0) {
        a_00 = (secp256k1_fe *)auStack_130;
        psVar12 = (secp256k1_fe *)0x5;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,1);
        if (iVar2 == 0) goto LAB_0014521b;
      }
    }
  }
  else {
LAB_001452df:
    secp256k1_modinv64_cold_6();
  }
  secp256k1_modinv64_cold_7();
LAB_001452e9:
  secp256k1_modinv64_cold_3();
  uVar4 = (ulong)((uint)psVar12->n[0] & 1);
  uVar7 = -uVar4;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar12);
  uVar3 = psVar12->n[1] << 0x3f | psVar12->n[0] >> 1;
  a_00->n[0] = uVar3 + (uVar7 & 0xdfe92f46681b20a1);
  uVar19 = psVar12->n[2] << 0x3f | psVar12->n[1] >> 1;
  uVar3 = (ulong)CARRY8(uVar7 & 0xdfe92f46681b20a1,uVar3);
  uVar6 = (uVar7 & 0x5d576e7357a4501d) + uVar19;
  bVar23 = CARRY8(uVar7 & 0x5d576e7357a4501d,uVar19) || CARRY8(uVar6,uVar3);
  a_00->n[1] = uVar6 + uVar3;
  uVar3 = psVar12->n[3] << 0x3f | psVar12->n[2] >> 1;
  a_00->n[2] = (uVar3 - uVar4) + (ulong)bVar23;
  a_00->n[3] = (uVar7 & 0x7fffffffffffffff) + (psVar12->n[3] >> 1) +
               (ulong)(CARRY8(uVar3,uVar7) || CARRY8(uVar3 + uVar7,(ulong)bVar23));
  secp256k1_scalar_verify((secp256k1_scalar *)a_00);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_half(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY_MAGNITUDE(r, 31);

    secp256k1_fe_impl_half(r);
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}